

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestingFixture.cpp
# Opt level: O1

void __thiscall TestTestingFixture::~TestTestingFixture(TestTestingFixture *this)

{
  ExecFunction *pEVar1;
  
  this->_vptr_TestTestingFixture = (_func_int **)&PTR__TestTestingFixture_003a84e8;
  (*this->registry_->_vptr_TestRegistry[0x17])(this->registry_,0);
  pEVar1 = this->genTest_->testFunction_;
  if ((pEVar1 != (ExecFunction *)0x0) && (this->ownsExecFunction_ == true)) {
    (*pEVar1->_vptr_ExecFunction[1])();
  }
  if (this->registry_ != (TestRegistry *)0x0) {
    (*this->registry_->_vptr_TestRegistry[1])();
  }
  if (this->result_ != (TestResult *)0x0) {
    (*this->result_->_vptr_TestResult[1])();
  }
  if (this->output_ != (StringBufferTestOutput *)0x0) {
    (*(this->output_->super_TestOutput)._vptr_TestOutput[1])();
  }
  if (this->genTest_ != (ExecFunctionTestShell *)0x0) {
    (*(this->genTest_->super_UtestShell)._vptr_UtestShell[1])();
    return;
  }
  return;
}

Assistant:

TestTestingFixture::~TestTestingFixture()
{
    registry_->setCurrentRegistry(NULLPTR);
    clearExecFunction();
    delete registry_;
    delete result_;
    delete output_;
    delete genTest_;
}